

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::PolygonOffsetTests::init(PolygonOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  char *__s;
  _func_int **pp_Var3;
  TestNode *pTVar4;
  long *plVar5;
  long *extraout_RAX;
  long *plVar6;
  long lVar7;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  TestNode *local_60;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  lVar7 = 0x10;
  local_60 = (TestNode *)this;
  do {
    pTVar4 = (TestNode *)operator_new(0x90);
    pCVar2 = (Context *)local_60[1]._vptr_TestNode;
    __s = *(char **)((long)&DAT_0218c7b0 + lVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar1 = *(undefined4 *)((long)&PTR_iterate_0218c7a0 + lVar7);
    local_38 = lVar7;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_80,
               "test enable GL_POLYGON_OFFSET_FILL");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218c838;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,"test polygon offset");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218c968;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,"test polygon offset");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218c9c0;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,
               "test polygon offset clamping");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218ca18;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,
               "test polygon offset factor");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218ca70;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,
               "test polygon offset factor");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218cac8;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x90);
    pp_Var3 = local_60[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_81);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,(TestContext *)*pp_Var3,(char *)local_80,
               "test polygon offset factor");
    pTVar4[1]._vptr_TestNode = pp_Var3;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4[1].m_name._M_dataplus._M_p = __s;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 200;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0218cb20;
    tcu::TestNode::addChild(local_60,pTVar4);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    lVar7 = local_38;
    plVar5 = local_48;
    if (local_58[0] != plVar5) {
      operator_delete(local_58[0],local_48[0] + 1);
      plVar5 = extraout_RAX;
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  return (int)plVar5;
}

Assistant:

void PolygonOffsetTests::init (void)
{
	const struct DepthBufferFormat
	{
		enum BufferType
		{
			TYPE_FIXED_POINT,
			TYPE_FLOATING_POINT,
			TYPE_UNKNOWN
		};

		GLenum		internalFormat;
		int			bits;
		BufferType	floatingPoint;
		const char* name;
	} depthFormats[]=
	{
		{ 0,						0,		DepthBufferFormat::TYPE_UNKNOWN,		"default" },
		{ GL_DEPTH_COMPONENT16,		16,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed16" },
		{ GL_DEPTH_COMPONENT24,		24,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed24" },
		{ GL_DEPTH_COMPONENT32F,	32,		DepthBufferFormat::TYPE_FLOATING_POINT,	"float32" },
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthFormats); ++ndx)
	{
		const DepthBufferFormat& format = depthFormats[ndx];

		// enable works?
		addChild(new UsageTestCase(m_context, (std::string(format.name) + "_enable").c_str(), "test enable GL_POLYGON_OFFSET_FILL", format.internalFormat, format.name));

		// Really moves the polygons ?
		addChild(new UsageDisplacementTestCase(m_context, (std::string(format.name) + "_displacement_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Really moves the polygons to right direction ?
		addChild(new UsagePositiveNegativeTestCase(m_context, (std::string(format.name) + "_render_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Is total result clamped to [0,1] like promised?
		addChild(new ResultClampingTestCase(m_context, (std::string(format.name) + "_result_depth_clamp").c_str(), "test polygon offset clamping", format.internalFormat, format.name));

		// Slope really moves the polygon?
		addChild(new UsageSlopeTestCase(m_context, (std::string(format.name) + "_render_with_factor").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with zero slope
		addChild(new ZeroSlopeTestCase(m_context, (std::string(format.name) + "_factor_0_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with 1.0 slope
		addChild(new OneSlopeTestCase(m_context, (std::string(format.name) + "_factor_1_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));
	}
}